

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

uint nullcDebugGetSourceLocationModuleIndex(char *sourceLocation)

{
  long lVar1;
  uint *puVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (sourceLocation != (char *)0x0) {
    if (NULLC::linker == 0) {
      lVar1 = 0;
      uVar3 = 0;
      lVar4 = 0;
    }
    else {
      uVar3 = (ulong)*(uint *)(NULLC::linker + 0x28c);
      lVar1 = *(long *)(NULLC::linker + 0x280);
      lVar4 = *(long *)(NULLC::linker + 0x2a0);
    }
    puVar2 = (uint *)(lVar1 + 0x18);
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      if (((char *)((ulong)puVar2[-1] + lVar4) <= sourceLocation) &&
         (sourceLocation < (char *)((ulong)puVar2[-1] + lVar4) + *puVar2)) {
        return (uint)uVar5;
      }
      puVar2 = puVar2 + 7;
    }
  }
  return 0xffffffff;
}

Assistant:

unsigned nullcDebugGetSourceLocationModuleIndex(const char *sourceLocation)
{
	if(!sourceLocation)
		return ~0u;

	unsigned moduleCount = 0;
	ExternModuleInfo *modules = nullcDebugModuleInfo(&moduleCount);

	const char* fullSource = nullcDebugSource();

	for(unsigned i = 0; i < moduleCount; i++)
	{
		ExternModuleInfo &moduleInfo = modules[i];

		const char *start = fullSource + moduleInfo.sourceOffset;
		const char *end = start + moduleInfo.sourceSize;

		if(sourceLocation >= start && sourceLocation < end)
			return i;
	}

	return ~0u;
}